

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat3 * dja::mat3::rotation(mat3 *__return_storage_ptr__,vec3 *axis,float_t rad)

{
  quaternion local_24;
  float_t local_14;
  vec3 *pvStack_10;
  float_t rad_local;
  vec3 *axis_local;
  
  local_14 = rad;
  pvStack_10 = axis;
  local_24 = quaternion::rotation(axis,rad);
  rotation(__return_storage_ptr__,&local_24);
  return __return_storage_ptr__;
}

Assistant:

mat3 mat3::rotation(const vec3& axis, float_t rad)
{
    return rotation(quaternion::rotation(axis, rad));
}